

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

int ompt_get_state(ompt_wait_id_t *wait_id)

{
  int thread_state;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 local_4;
  
  if (((ulong)ompt_enabled & 1) == 0) {
    local_4 = 0;
  }
  else {
    local_4 = __ompt_get_state_internal
                        ((ompt_wait_id_t *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (local_4 == 0x102) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_state(ompt_wait_id_t *wait_id) {
  if (!ompt_enabled.enabled)
    return ompt_state_work_serial;
  int thread_state = __ompt_get_state_internal(wait_id);

  if (thread_state == ompt_state_undefined) {
    thread_state = ompt_state_work_serial;
  }

  return thread_state;
}